

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O3

void Ptex::v2_2::(anonymous_namespace)::Apply<Ptex::v2_2::PtexHalf,1>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  ushort *puVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  float *pfVar5;
  ushort *puVar6;
  long lVar7;
  float *pfVar8;
  float fVar9;
  
  bVar3 = (k->res).ulog2;
  if (k->vw << (bVar3 & 0x1f) != 0) {
    puVar6 = (ushort *)((long)data + ((long)(k->v << (bVar3 & 0x1f)) + (long)k->u) * 2);
    puVar1 = puVar6 + (k->vw << (bVar3 & 0x1f));
    pfVar5 = k->ku;
    pfVar8 = k->kv;
    iVar4 = k->uw;
    do {
      fVar9 = *pfVar5 * *(float *)(PtexHalf::h2fTable + (ulong)*puVar6 * 4);
      if (iVar4 != 1) {
        lVar7 = 0;
        do {
          fVar9 = fVar9 + *(float *)(PtexHalf::h2fTable +
                                    (ulong)*(ushort *)((long)puVar6 + lVar7 + 2) * 4) *
                          *(float *)((long)pfVar5 + lVar7 * 2 + 4);
          lVar7 = lVar7 + 2;
        } while ((long)iVar4 * 2 + -2 != lVar7);
        puVar6 = (ushort *)((long)puVar6 + lVar7);
      }
      fVar2 = *pfVar8;
      pfVar8 = pfVar8 + 1;
      *result = fVar9 * fVar2 + *result;
      puVar6 = puVar6 + (long)((1 << (bVar3 & 0x1f)) - iVar4) + 1;
    } while (puVar6 != puVar1);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }